

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O3

bool __thiscall qpdf::Array::erase(Array *this,int at)

{
  size_t *psVar1;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var2;
  _Rb_tree_header *p_Var3;
  QPDF_Array *pQVar4;
  QPDF_Array *pQVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  int iVar9;
  _Self __tmp;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>,_std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>_>
  pVar10;
  node_type nh;
  int local_74;
  node_type local_70;
  insert_return_type local_58;
  
  local_74 = at;
  pQVar4 = array(this);
  if (-1 < at) {
    pQVar5 = array(this);
    _Var2._M_head_impl =
         (pQVar5->sp)._M_t.
         super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
         super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
    if (_Var2._M_head_impl == (Sparse *)0x0) {
      iVar9 = (int)((ulong)((long)(pQVar5->elements).
                                  super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pQVar5->elements).
                                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    else {
      iVar9 = (_Var2._M_head_impl)->size;
    }
    if (at < iVar9) {
      _Var2._M_head_impl =
           (pQVar4->sp)._M_t.
           super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
           super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
           super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
      if (_Var2._M_head_impl == (Sparse *)0x0) {
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_erase
                  (&pQVar4->elements,
                   (pQVar4->elements).
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                   super__Vector_impl_data._M_start + (uint)at);
      }
      else {
        p_Var6 = *(_Base_ptr *)((long)&(_Var2._M_head_impl)->elements + 0x10);
        if (p_Var6 != (_Base_ptr)0x0) {
          p_Var3 = (_Rb_tree_header *)((long)&(_Var2._M_head_impl)->elements + 8);
          p_Var7 = (_Rb_tree_node_base *)p_Var3;
          do {
            if (at <= (int)p_Var6[1]._M_color) {
              p_Var7 = p_Var6;
            }
            p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < at];
          } while (p_Var6 != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var7 != p_Var3) {
            if (p_Var7[1]._M_color == at) {
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
              pVar10 = std::
                       _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                       ::equal_range(&((_Var2._M_head_impl)->elements)._M_t,&local_74);
              std::
              _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
              ::_M_erase_aux(&((_Var2._M_head_impl)->elements)._M_t,(_Base_ptr)pVar10.first._M_node,
                             (_Base_ptr)pVar10.second._M_node);
            }
            if ((_Rb_tree_header *)p_Var7 != p_Var3) {
              do {
                _Var2._M_head_impl =
                     (pQVar4->sp)._M_t.
                     super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                     .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
                p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
                local_70.
                super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                ._M_ptr = (pointer)std::_Rb_tree_rebalance_for_erase
                                             (p_Var7,(_Rb_tree_node_base *)
                                                     ((long)&(_Var2._M_head_impl)->elements + 8));
                psVar1 = (size_t *)((long)&(_Var2._M_head_impl)->elements + 0x28);
                *psVar1 = *psVar1 - 1;
                local_70._M_pkey =
                     (__pointer<int>)
                     &(local_70.
                       super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                      ._M_ptr)->_M_storage;
                if (local_70.
                    super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                    ._M_ptr == (pointer)0x0) {
                  local_70._M_pkey = (__pointer<int>)0x0;
                }
                local_70._M_pmapped =
                     (__pointer<typename_pair<const_int,_QPDFObjectHandle>::second_type>)
                     (((local_70.
                        super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                       ._M_ptr)->_M_storage)._M_storage + 8);
                if (local_70.
                    super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                    ._M_ptr == (pointer)0x0) {
                  local_70._M_pmapped =
                       (__pointer<typename_pair<const_int,_QPDFObjectHandle>::second_type>)0x0;
                }
                *(int *)((__aligned_membuf<std::pair<const_int,_QPDFObjectHandle>_> *)
                        local_70._M_pkey)->_M_storage =
                     *(int *)((__aligned_membuf<std::pair<const_int,_QPDFObjectHandle>_> *)
                             local_70._M_pkey)->_M_storage + -1;
                std::
                _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                ::_M_reinsert_node_unique
                          (&local_58,
                           &(((pQVar4->sp)._M_t.
                              super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                              .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)->
                            elements)._M_t,&local_70);
                if (local_58.node.
                    super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                    ._M_ptr != (pointer)0x0) {
                  std::
                  _Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                  ::_M_reset(&local_58.node.
                              super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                            );
                }
                if (local_70.
                    super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                    ._M_ptr != (pointer)0x0) {
                  std::
                  _Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                  ::_M_reset(&local_70.
                              super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                            );
                }
                p_Var7 = p_Var8;
              } while ((_Rb_tree_header *)p_Var8 != p_Var3);
            }
          }
        }
        _Var2._M_head_impl =
             (pQVar4->sp)._M_t.
             super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>.
             _M_t.
             super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
             super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
        (_Var2._M_head_impl)->size = (_Var2._M_head_impl)->size + -1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool
Array::erase(int at)
{
    auto a = array();
    if (at < 0 || at >= size()) {
        return false;
    }
    if (a->sp) {
        auto end = a->sp->elements.end();
        if (auto iter = a->sp->elements.lower_bound(at); iter != end) {
            if (iter->first == at) {
                iter++;
                a->sp->elements.erase(at);
            }

            while (iter != end) {
                auto nh = a->sp->elements.extract(iter++);
                --nh.key();
                a->sp->elements.insert(std::move(nh));
            }
        }
        --(a->sp->size);
    } else {
        a->elements.erase(a->elements.cbegin() + at);
    }
    return true;
}